

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_bfba::ktxTexture_calcImageSize_ImageSizeAtEachLevelRGB2D_Test::TestBody
          (ktxTexture_calcImageSize_ImageSizeAtEachLevelRGB2D_Test *this)

{
  size_t sVar1;
  pointer *__ptr_4;
  pointer *__ptr;
  char *pcVar2;
  char *in_R9;
  uint *rhs;
  ulong uVar3;
  uint *rhs_00;
  int *piVar4;
  ktx_size_t imageSize;
  ktxTexture *texture;
  ktx_error_code_e result;
  ktx_uint32_t ktx2sizes [4];
  ktx_uint32_t ktx1sizes [4];
  AssertHelper local_d8;
  AssertHelper local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  long local_98;
  ktx_error_code_e local_8c;
  uint local_88 [10];
  undefined8 local_60 [2];
  undefined8 local_50;
  undefined8 uStack_48;
  ulong local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  local_98 = 0;
  local_50 = 0x900000009;
  uStack_48 = 0x200000001;
  local_60[0] = 0x1700008051;
  local_34 = 0;
  local_38 = 1;
  local_40 = 0x100000004;
  local_88[4] = 0xfc;
  local_88[5] = 0x30;
  local_88[6] = 0x10;
  local_88[7] = 4;
  local_88[0] = 0xf3;
  local_88[1] = 0x30;
  local_88[2] = 0xc;
  local_88[3] = 3;
  local_8c = ktxTexture1_Create(local_60,0);
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_c8._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_b8,"result","KTX_SUCCESS",&local_8c,(ktx_error_code_e *)&local_c8);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x4f9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl._0_1_ = local_98 != 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_98 == 0) {
    testing::Message::Message((Message *)&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_d8.data_)->line,"ktxTexture1_Create failed: ",0x1b);
    pcVar2 = (char *)ktxErrorString(local_8c);
    piVar4 = &(local_d8.data_)->line;
    if (pcVar2 == (char *)0x0) {
      sVar1 = 6;
      pcVar2 = "(null)";
    }
    else {
      sVar1 = strlen(pcVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar4,pcVar2,sVar1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)&local_c8,(AssertionResult *)0x17796e,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x4fa,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
    }
    if (local_d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_d8.data_ + 8))();
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
  }
  else {
    if ((int)local_40 != 0) {
      rhs_00 = local_88 + 4;
      rhs = local_88;
      uVar3 = 0;
      do {
        local_c8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ktxTexture_calcImageSize(local_98,uVar3 & 0xffffffff,1);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)local_b8,"imageSize","ktx1sizes[i]",(unsigned_long *)&local_c8,rhs_00
                  );
        if (local_b8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_d8);
          pcVar2 = "";
          if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar2 = (local_b0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0x500,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if (local_d8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_d8.data_ + 8))();
          }
        }
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b0,local_b0);
        }
        local_c8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ktxTexture_calcImageSize(local_98,uVar3 & 0xffffffff,2);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)local_b8,"imageSize","ktx2sizes[i]",(unsigned_long *)&local_c8,rhs);
        if (local_b8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_d8);
          pcVar2 = "";
          if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar2 = (local_b0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0x503,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          if (local_d8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_d8.data_ + 8))();
          }
        }
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b0,local_b0);
        }
        uVar3 = uVar3 + 1;
        rhs_00 = rhs_00 + 1;
        rhs = rhs + 1;
      } while (uVar3 < (local_40 & 0xffffffff));
      if (local_98 == 0) {
        return;
      }
    }
    (*(code *)**(undefined8 **)(local_98 + 8))();
  }
  return;
}

Assistant:

TEST(ktxTexture_calcImageSize, ImageSizeAtEachLevelRGB2D) {
    ktxTexture* texture = 0;
    TestCreateInfo createInfo(9, 9, 1, 2, GL_RGB8,
                              VK_FORMAT_R8G8B8_UNORM, KTX_FALSE, 1, 1);
    KTX_error_code result;
    // Sizes for 9x9, 4 level RGB8 texture.
    // level 0 ... level 4
    ktx_uint32_t ktx1sizes[] = {28*9, 12*4, 8*2, 4*1};
    ktx_uint32_t ktx2sizes[] = {27*9, 12*4, 6*2, 3*1};

    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                (ktxTexture1**)&texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);
    for (ktx_uint32_t i = 0; i < createInfo.numLevels; i++) {
        ktx_size_t imageSize;
        imageSize = ktxTexture_calcImageSize(texture, i,
                                             KTX_FORMAT_VERSION_ONE);
        EXPECT_EQ(imageSize, ktx1sizes[i]);
        imageSize = ktxTexture_calcImageSize(texture, i,
                                             KTX_FORMAT_VERSION_TWO);
        EXPECT_EQ(imageSize, ktx2sizes[i]);
    }
    if (texture)
        ktxTexture_Destroy(texture);
}